

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool processSources(cmTarget *tgt,
                   vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  cmMakefile *mf_00;
  reference ppTVar4;
  cmCompiledGeneratorExpression *pcVar5;
  char *pcVar6;
  cmSourceFile *this;
  cmListFileBacktrace *bt;
  ostream *poVar7;
  cmMakefile *this_00;
  reference pbVar8;
  ulong uVar9;
  cmake *pcVar10;
  string *psVar11;
  cmListFileBacktrace local_448;
  allocator local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_350;
  undefined1 local_338 [8];
  string src_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_310;
  iterator li;
  string usedSources;
  undefined1 local_2c8 [8];
  ostringstream err;
  cmake *cm;
  string fullPath;
  string e;
  cmSourceFile *sf;
  string *src;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  iterator i;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  string *targetName;
  cmLinkImplItem *item;
  const_iterator end;
  const_iterator it;
  bool contextDependent;
  cmMakefile *mf;
  bool debugSources_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *uniqueSrcs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  *entries_local;
  cmTarget *tgt_local;
  
  mf_00 = cmTarget::GetMakefile(tgt);
  bVar1 = 0;
  end = std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::begin(entries);
  item = (cmLinkImplItem *)
         std::
         vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ::end(entries);
  while (bVar3 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                                  *)&item), bVar2 = bVar1, bVar3) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*ppTVar4)->LinkImplItem;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar5 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
    std::__cxx11::string::string((string *)&local_d0);
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar5,mf_00,config,false,tgt,tgt,dagChecker,&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,pcVar6,(allocator *)((long)&i._M_current + 3));
    cmSystemTools::ExpandListArgument
              (&local_b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 3));
    std::__cxx11::string::~string((string *)&local_d0);
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar5 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
    bVar3 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar5);
    if (bVar3) {
      bVar1 = 1;
    }
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
    while( true ) {
      src = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_90);
      bVar3 = __gnu_cxx::operator!=
                        (&local_e8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&src);
      if (!bVar3) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e8);
      this = cmMakefile::GetOrCreateSource(mf_00,pbVar8,false);
      std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8));
      psVar11 = cmSourceFile::GetFullPath(this,(string *)(fullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&cm,(string *)psVar11);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar6);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              poVar7 = std::operator<<((ostream *)local_2c8,"Target \"");
              poVar7 = std::operator<<(poVar7,(string *)
                                              entrySources.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar7 = std::operator<<(poVar7,
                                       "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
              poVar7 = std::operator<<(poVar7,(string *)pbVar8);
              std::operator<<(poVar7,"\"");
            }
            else {
              poVar7 = std::operator<<((ostream *)local_2c8,
                                       "Found relative path while evaluating sources of \"");
              psVar11 = cmTarget::GetName_abi_cxx11_(tgt);
              poVar7 = std::operator<<(poVar7,(string *)psVar11);
              poVar7 = std::operator<<(poVar7,"\":\n  \"");
              poVar7 = std::operator<<(poVar7,(string *)pbVar8);
              std::operator<<(poVar7,"\"\n");
            }
            this_00 = cmTarget::GetMakefile(tgt);
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)((long)&usedSources.field_2 + 8))
            ;
            std::__cxx11::string::~string((string *)(usedSources.field_2._M_local_buf + 8));
            bVar3 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
            tgt_local._7_1_ = bVar1;
            goto LAB_005f9c17;
          }
        }
        std::__cxx11::string::operator=((string *)pbVar8,(string *)&cm);
        bVar3 = false;
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          pcVar10 = cmMakefile::GetCMakeInstance(mf_00);
          bt = cmTarget::GetBacktrace(tgt);
          cmake::IssueMessage(pcVar10,FATAL_ERROR,(string *)((long)&fullPath.field_2 + 8),bt);
        }
        bVar3 = true;
        tgt_local._7_1_ = bVar1;
      }
LAB_005f9c17:
      std::__cxx11::string::~string((string *)&cm);
      std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
      if (bVar3) goto LAB_005fa035;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e8);
    }
    std::__cxx11::string::string((string *)&li);
    local_310._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
    while( true ) {
      src_1.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
      bVar3 = __gnu_cxx::operator!=
                        (&local_310,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&src_1.field_2 + 8));
      if (!bVar3) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_310);
      std::__cxx11::string::string((string *)local_338,(string *)pbVar8);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_350,uniqueSrcs,(value_type *)local_338);
      if (((local_350.second & 1U) != 0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(srcs,(value_type *)local_338), debugSources)) {
        std::operator+(&local_390," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338);
        std::operator+(&local_370,&local_390,"\n");
        std::__cxx11::string::operator+=((string *)&li,(string *)&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_390);
      }
      std::__cxx11::string::~string((string *)local_338);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_310);
    }
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar10 = cmMakefile::GetCMakeInstance(mf_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_410,"Used sources for target ",&local_411);
      psVar11 = cmTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_3f0,&local_410,psVar11);
      std::operator+(&local_3d0,&local_3f0,":\n");
      std::operator+(&local_3b0,&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li);
      ppTVar4 = __gnu_cxx::
                __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                ::operator*(&end);
      pcVar5 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
      cmCompiledGeneratorExpression::GetBacktrace(&local_448,pcVar5);
      cmake::IssueMessage(pcVar10,LOG,&local_3b0,&local_448);
      cmListFileBacktrace::~cmListFileBacktrace(&local_448);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
    }
    std::__cxx11::string::~string((string *)&li);
    bVar3 = false;
LAB_005fa035:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
    bVar2 = tgt_local._7_1_;
    if (bVar3) break;
    __gnu_cxx::
    __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
    ::operator++(&end);
  }
  tgt_local._7_1_ = bVar2;
  return (bool)(tgt_local._7_1_ & 1);
}

Assistant:

static bool processSources(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &srcs,
      UNORDERED_SET<std::string> &uniqueSrcs,
      cmGeneratorExpressionDAGChecker *dagChecker,
      std::string const& config, bool debugSources)
{
  cmMakefile *mf = tgt->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              tgt,
                                              dagChecker),
                                    entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition())
      {
      contextDependent = true;
      }

    for(std::vector<std::string>::iterator i = entrySources.begin();
        i != entrySources.end(); ++i)
      {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if(fullPath.empty())
        {
        if(!e.empty())
          {
          cmake* cm = mf->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e,
                          tgt->GetBacktrace());
          }
        return contextDependent;
        }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str()))
        {
        std::ostringstream err;
        if (!targetName.empty())
          {
          err << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_SOURCES:\n"
            "  \"" << src << "\"";
          }
        else
          {
          err << "Found relative path while evaluating sources of "
          "\"" << tgt->GetName() << "\":\n  \"" << src << "\"\n";
          }
        tgt->GetMakefile()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
        }
      src = fullPath;
      }
    std::string usedSources;
    for(std::vector<std::string>::iterator
          li = entrySources.begin(); li != entrySources.end(); ++li)
      {
      std::string src = *li;

      if(uniqueSrcs.insert(src).second)
        {
        srcs.push_back(src);
        if (debugSources)
          {
          usedSources += " * " + src + "\n";
          }
        }
      }
    if (!usedSources.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used sources for target ")
                            + tgt->GetName() + ":\n"
                            + usedSources, (*it)->ge->GetBacktrace());
      }
    }
  return contextDependent;
}